

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O0

bool __thiscall DyndepParser::ParseLet(DyndepParser *this,string *key,EvalString *value,string *err)

{
  bool bVar1;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *err_local;
  EvalString *value_local;
  string *key_local;
  DyndepParser *this_local;
  
  local_30 = err;
  err_local = (string *)value;
  value_local = (EvalString *)key;
  key_local = (string *)this;
  bVar1 = Lexer::ReadIdent(&(this->super_Parser).lexer_,key);
  if (bVar1) {
    bVar1 = Parser::ExpectToken(&this->super_Parser,EQUALS,local_30);
    if (bVar1) {
      bVar1 = Lexer::ReadVarValue(&(this->super_Parser).lexer_,(EvalString *)err_local,local_30);
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"expected variable name",&local_51);
    this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_50,local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DyndepParser::ParseLet(string* key, EvalString* value, string* err) {
  if (!lexer_.ReadIdent(key))
    return lexer_.Error("expected variable name", err);
  if (!ExpectToken(Lexer::EQUALS, err))
    return false;
  if (!lexer_.ReadVarValue(value, err))
    return false;
  return true;
}